

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

string * __thiscall
MinVR::VRDataIndex::
addDataSpecialized<std::vector<float,std::allocator<float>>,(MinVR::VRCORETYPE_ID)5>
          (string *__return_storage_ptr__,VRDataIndex *this,string *key,
          vector<float,_std::allocator<float>_> *value)

{
  int iVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  _Var2;
  runtime_error *this_00;
  VRDatumPtr *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_bool>
  pVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string ns;
  VRDatumPtr local_b0;
  VRContainer cValue;
  VRDatumPtr obj;
  _Vector_base<float,_std::allocator<float>_> local_78;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)key);
  if (*(key->_M_dataplus)._M_p != '/') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"/",(allocator<char> *)&cValue);
    std::operator+(&ns,&local_100,key);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ns);
    std::__cxx11::string::~string((string *)&ns);
    std::__cxx11::string::~string((string *)&local_100);
  }
  local_100._M_dataplus._M_p = (pointer)0x0;
  local_100._M_string_length = (size_type)operator_new(4);
  *(undefined4 *)local_100._M_string_length = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MinVR::VRDatumPtr,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
              *)&ns,__return_storage_ptr__,(VRDatumPtr *)&local_100);
  pVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>,std::_Select1st<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>,std::_Select1st<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MinVR::VRDatumPtr>>>
                      *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
                              *)&ns);
  _Var2 = pVar3.first._M_node;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
           *)&ns);
  VRDatumPtr::~VRDatumPtr((VRDatumPtr *)&local_100);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (this->_overwrite < 1) {
      if (this->_overwrite != 0) {
        return __return_storage_ptr__;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ns,"overwriting values not allowed",(allocator<char> *)&local_100);
      std::runtime_error::runtime_error(this_00,(string *)&ns);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_b0.pData = *(VRDatum_conflict **)(_Var2._M_node + 2);
    local_b0.reference = (VRDatumPtrRC *)_Var2._M_node[2]._M_parent;
    ((_Base_ptr)local_b0.reference)->_M_color = ((_Base_ptr)local_b0.reference)->_M_color + _S_black
    ;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_78,value);
    _setValueSpecialized(this,&local_b0,(VRFloatArray *)&local_78);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_78);
    this_01 = &local_b0;
  }
  else {
    VRDatumFactory::CreateVRDatum((VRDatumFactory *)&obj,0x125318,(void *)0x5);
    VRDatumPtr::operator=((VRDatumPtr *)(_Var2._M_node + 2),&obj);
    cValue.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&cValue;
    cValue.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    cValue.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         cValue.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    _explodeName((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ns,__return_storage_ptr__);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&cValue,(value_type *)(ns._M_string_length - 0x20));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ns);
    _getNameSpace(&ns,__return_storage_ptr__);
    iVar1 = std::__cxx11::string::compare((char *)&ns);
    if (iVar1 != 0) {
      std::__cxx11::string::substr((ulong)&local_100,(ulong)&ns);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_60,&cValue);
      addData(&local_48,this,&local_100,(VRContainer *)&local_60);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&local_60);
      std::__cxx11::string::~string((string *)&local_100);
    }
    std::__cxx11::string::~string((string *)&ns);
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&cValue.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    this_01 = &obj;
  }
  VRDatumPtr::~VRDatumPtr(this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string addDataSpecialized(const std::string key, T value) {

    // All names must be in some namespace. If there is no namespace,
    // put this into the root namespace.
    std::string fixedValName = key;
    if (key[0] != '/') fixedValName = std::string("/") + key;

    std::pair<VRDataMap::iterator, bool>res =
      _theIndex.insert(VRDataMap::value_type(fixedValName, (VRDatumPtr)NULL));

    // Was it already used?
    if (res.second) {

      VRDatumPtr obj = _factory.CreateVRDatum(TID, &value);
      res.first->second = obj;

      // Add this value to the parent container, if any.
      VRContainer cValue;
      cValue.push_back(_explodeName(fixedValName).back());
      std::string ns = _getNameSpace(fixedValName);
      // The parent container is the namespace minus the trailing /.
      if (ns.compare("/") != 0) addData(ns.substr(0, ns.size() - 1), cValue);

    } else {

      // Entry already exists. Decide whether to modify or throw an exception.
      if (_overwrite > 0) {

        _setValueSpecialized(res.first->second, (T)value);

      } else if (_overwrite == 0) {

        throw std::runtime_error(std::string("overwriting values not allowed"));
      }
    }

    return fixedValName;
  }